

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

int SSL_ECH_KEYS_add(SSL_ECH_KEYS *configs,int is_retry_config,uint8_t *ech_config,
                    size_t ech_config_len,EVP_HPKE_KEY *key)

{
  bool bVar1;
  uint uVar2;
  Span<const_unsigned_char> ech_config_00;
  UniquePtr<ECHServerConfig> parsed_config;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> local_30;
  
  parsed_config._M_t.super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::ECHServerConfig,_bssl::internal::Deleter,_true,_true>)
       bssl::New<bssl::ECHServerConfig>();
  if ((tuple<bssl::ECHServerConfig_*,_bssl::internal::Deleter>)
      parsed_config._M_t.super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bssl::ECHServerConfig_*,_false>)0x0) {
    uVar2 = 0;
  }
  else {
    ech_config_00.size_ = ech_config_len;
    ech_config_00.data_ = ech_config;
    bVar1 = bssl::ECHServerConfig::Init
                      ((ECHServerConfig *)
                       parsed_config._M_t.
                       super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl,
                       ech_config_00,key,is_retry_config != 0);
    if (bVar1) {
      local_30._M_t.super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl =
           parsed_config._M_t.super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl;
      parsed_config._M_t.super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl =
           (__uniq_ptr_data<bssl::ECHServerConfig,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>)0x0;
      bVar1 = bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::Push
                        (&configs->configs,&local_30);
      std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::~unique_ptr(&local_30);
      uVar2 = (uint)bVar1;
    }
    else {
      uVar2 = 0;
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x40f);
    }
  }
  std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::~unique_ptr(&parsed_config);
  return uVar2;
}

Assistant:

int SSL_ECH_KEYS_add(SSL_ECH_KEYS *configs, int is_retry_config,
                     const uint8_t *ech_config, size_t ech_config_len,
                     const EVP_HPKE_KEY *key) {
  UniquePtr<ECHServerConfig> parsed_config = MakeUnique<ECHServerConfig>();
  if (!parsed_config) {
    return 0;
  }
  if (!parsed_config->Init(Span(ech_config, ech_config_len), key,
                           !!is_retry_config)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return 0;
  }
  if (!configs->configs.Push(std::move(parsed_config))) {
    return 0;
  }
  return 1;
}